

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_instance_cache.cpp
# Opt level: O2

void background_thread_connect(duckdb_instance_cache instance_cache,char *path)

{
  duckdb_state state;
  SourceLineInfo local_d8 [2];
  duckdb_state local_b4;
  BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&> local_b0;
  duckdb_database out_database;
  AssertionHandler catchAssertionHandler;
  StringRef local_28;
  
  state = duckdb_get_or_create_from_cache(instance_cache,path,&out_database,0,0);
  local_b0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x433f41;
  local_b0.super_ITransientExpression.m_isBinaryExpression = true;
  local_b0.super_ITransientExpression.m_result = false;
  local_b0.super_ITransientExpression._10_6_ = 0;
  local_d8[0].file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_instance_cache.cpp"
  ;
  local_d8[0].line = 0xe;
  Catch::StringRef::StringRef(&local_28,"state == DuckDBSuccess");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b0,local_d8,local_28,Normal);
  local_d8[0].file = (char *)&state;
  local_b4 = DuckDBSuccess;
  Catch::ExprLhs<duckdb_state_const&>::operator==
            (&local_b0,(ExprLhs<duckdb_state_const&> *)local_d8,&local_b4);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b0.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b0.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  duckdb_close(&out_database);
  return;
}

Assistant:

static void background_thread_connect(duckdb_instance_cache instance_cache, const char *path) {
	try {
		duckdb_database out_database;
		auto state = duckdb_get_or_create_from_cache(instance_cache, path, &out_database, nullptr, nullptr);
		REQUIRE(state == DuckDBSuccess);
		duckdb_close(&out_database);
	} catch (std::exception &ex) {
		FAIL(ex.what());
	}
}